

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

ParseLocation __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocation
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  _Base_ptr p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong uVar5;
  _Rb_tree_header *p_Var6;
  
  uVar5 = 0xffffffff00000000;
  uVar4 = 0xffffffff;
  CheckFieldIndex(field,index);
  p_Var3 = (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var6 = &(this->locations_)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var6->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var6) && (*(FieldDescriptor **)(p_Var1 + 1) <= field)) {
      iVar2 = 0;
      if (index != -1) {
        iVar2 = index;
      }
      if ((ulong)(long)iVar2 < (ulong)((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent >> 3)) {
        uVar4 = *(ulong *)(&(p_Var1[1]._M_parent)->_M_color + (long)iVar2 * 2);
        uVar5 = uVar4 & 0xffffffff00000000;
        uVar4 = uVar4 & 0xffffffff;
      }
    }
  }
  return (ParseLocation)(uVar4 | uVar5);
}

Assistant:

TextFormat::ParseLocation TextFormat::ParseInfoTree::GetLocation(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) { index = 0; }

  const vector<TextFormat::ParseLocation>* locations =
      FindOrNull(locations_, field);
  if (locations == NULL || index >= locations->size()) {
    return TextFormat::ParseLocation();
  }

  return (*locations)[index];
}